

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_bigint64.c
# Opt level: O3

int main(void)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  int local_b8;
  undefined4 local_b4;
  
  uVar6 = 0;
  do {
    iVar5 = 1 << ((byte)uVar6 & 0x1f);
    local_b4 = 0;
    local_b8 = iVar5;
    uVar4 = 4;
    do {
      bVar8 = uVar4 == 0;
      uVar4 = uVar4 - 1;
      if (bVar8) {
        uVar7 = uVar6 >> 4 & 0xfffffff;
        goto LAB_00102214;
      }
    } while (*(short *)((long)&local_b8 + uVar4 * 2) == 0);
    uVar7 = uVar6 >> 4 & 0xfffffff;
    if (uVar6 >> 4 != uVar4) {
LAB_00102214:
      TEST_RESULTS = TEST_RESULTS + 1;
      printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint64.c, line %d - %s\n"
             ,0x38,"big.size == n / _PDCLIB_BIGINT_DIGIT_BITS + 1");
    }
    local_b8 = 0;
    local_b4 = iVar5;
    lVar3 = 0;
    do {
      if (lVar3 == -4) goto LAB_00102265;
      lVar1 = lVar3 + -1;
      lVar2 = lVar3 * 2;
      lVar3 = lVar1;
    } while (*(short *)((long)&local_b4 + lVar2 + 2) == 0);
    if (uVar7 - 2 != lVar1) {
LAB_00102265:
      TEST_RESULTS = TEST_RESULTS + 1;
      printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint64.c, line %d - %s\n"
             ,0x3a,"big.size == n / _PDCLIB_BIGINT_DIGIT_BITS + DIGITS_PER_32BIT + 1");
    }
    uVar6 = uVar6 + 1;
    if ((int)uVar6 == 0x20) {
      return TEST_RESULTS;
    }
  } while( true );
}

Assistant:

int main( void )
{
#ifndef REGTEST
    _PDCLIB_bigint_t big;
    uint_least32_t value;
    unsigned n;

    for ( n = 0; n < 32; ++n )
    {
        value = UINT32_C( 1 ) << n;
        _PDCLIB_bigint64( &big, 0, value );
        TESTCASE( big.size == n / _PDCLIB_BIGINT_DIGIT_BITS + 1 );
        _PDCLIB_bigint64( &big, value, 0 );
        TESTCASE( big.size == n / _PDCLIB_BIGINT_DIGIT_BITS + DIGITS_PER_32BIT + 1 );
    }
#endif

    return TEST_RESULTS;
}